

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t y;
  int iVar1;
  wchar_t i;
  wchar_t wVar2;
  loc_conflict lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  wchar_t ac;
  wchar_t vc;
  wchar_t *local_68;
  wchar_t *local_60;
  wchar_t *local_58;
  ui_entry_combiner_funcs_conflict combiner;
  
  uVar4 = 7;
  if (details->alternate_color_first == false) {
    uVar4 = 0;
  }
  local_68 = label;
  local_60 = auxvals;
  local_58 = vals;
  if (((L'\x06' < info->ncolors) && (L'\x06' < info->nlabcolors)) && (L'\x06' < info->nsym)) {
    lVar3.y = 0;
    lVar3.x = (details->value_position).x;
    uVar7 = (ulong)(uint)(details->value_position).y;
    iVar1 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&combiner);
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                    ,0x2e6,
                    "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                   );
    }
    uVar6 = 0;
    uVar5 = 0;
    if (L'\0' < n) {
      uVar5 = (ulong)(uint)n;
    }
    i = L'd';
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      wVar2 = local_58[uVar6];
      i = wVar2;
      if ((wVar2 < L'É') && (i = local_60[uVar6], i < L'É')) {
        i = (i * wVar2) / 100;
      }
      wVar2 = convert_fa_res_level(i);
      Term_putch(lVar3.x,(wchar_t)uVar7,info->colors[(uint)(wVar2 + uVar4)],
                 info->symbols[(uint)wVar2]);
      lVar3 = loc_sum((loc_conflict)((ulong)lVar3 & 0xffffffff | uVar7 << 0x20),
                      (loc_conflict)details->position_step);
      uVar7 = (ulong)lVar3 >> 0x20;
      uVar4 = uVar4 ^ 7;
    }
    if ((L'\0' < nlabel) || (details->show_combined == true)) {
      (*combiner.vec_func)(n,local_58,local_60,&vc,&ac);
      if (L'\0' < nlabel) {
        if (details->known_rune == true) {
          i = vc;
          if ((vc < L'É') && (i = ac, ac < L'É')) {
            i = (ac * vc) / 100;
          }
          wVar2 = convert_fa_res_level(i);
          uVar7 = (ulong)(uint)wVar2;
        }
        else {
          uVar7 = 0;
        }
        wVar2 = (details->label_position).x;
        y = (details->label_position).y;
        if (details->vertical_label == true) {
          for (uVar5 = 0; (uint)nlabel != uVar5; uVar5 = uVar5 + 1) {
            Term_putch(wVar2,y + (int)uVar5,info->label_colors[uVar7],local_68[uVar5]);
          }
        }
        else {
          safe_queue_chars(wVar2,y,nlabel,info->label_colors[uVar7],local_68);
        }
      }
      if (details->show_combined == true) {
        show_combined_generic(info,details,i,i);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 7 && info->nlabcolors >= 7 && info->nsym >= 7",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                ,0x2e3,
                "void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_COMPACT_PERCENTAGE_RESIST_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac, val = RES_LEVEL_BASE;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 7 && info->nlabcolors >= 7 &&
		info->nsym >= 7);

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	for (i = 0; i < n; ++i) {
		int effect_index;
		/* Hack - this should be rewritten without aux - NRM */
		val = RES_LEVEL_BASE;

		if (vals[i] > RES_LEVEL_MIN) {
			val = vals[i];
		} else if (auxvals[i] > RES_LEVEL_MIN) {
			val = auxvals[i];
		} else {
			val = (vals[i] * auxvals[i]) / RES_LEVEL_BASE;
		}
		effect_index = convert_fa_res_level(val);

		assert(effect_index >= 0 && effect_index < 7);
		Term_putch(p.x, p.y,
			info->colors[effect_index + color_offset],
			info->symbols[effect_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 7;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int effect_index = 0;

		if (details->known_rune) {
			/* Hack - this should be rewritten without aux - NRM */
			val = RES_LEVEL_BASE;

			if (vc > RES_LEVEL_MIN) {
				val = vc;
			} else if (ac > RES_LEVEL_MIN) {
				val = ac;
			} else {
				val = (vc * ac) / RES_LEVEL_BASE;
			}
			effect_index = convert_fa_res_level(val);

			assert(effect_index >= 0 && effect_index < 7);
		}

		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[effect_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[effect_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, val, val);
	}
}